

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

float_t __thiscall djb::microfacet::vndf(microfacet *this,vec3 *wm,vec3 *wi,args *args)

{
  float_t fVar1;
  float fVar2;
  float fVar3;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar4;
  undefined4 in_XMM1_Db;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  vec3 vVar8;
  float_t nrmsqr;
  undefined8 local_68;
  float local_60;
  float local_5c;
  undefined1 local_58 [16];
  vec3 local_48;
  undefined1 local_38 [16];
  float local_28;
  undefined4 uStack_24;
  undefined1 auVar6 [16];
  
  vVar8 = djb::operator*(&args->mtra,wm);
  fVar4 = vVar8.z;
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_8_ = vVar8._0_8_;
  local_58._12_4_ = extraout_XMM0_Dd;
  vVar8 = djb::operator*(&args->minv,wi);
  local_48.z = vVar8.z;
  local_48._0_8_ = vVar8._0_8_;
  vVar8 = normalize(&local_48);
  local_60 = vVar8.z;
  local_68 = vVar8._0_8_;
  local_28 = local_60 * fVar4 + vVar8.x * (float)local_58._0_4_ + (float)local_58._4_4_ * vVar8.y;
  fVar1 = 0.0;
  if (0.0 < local_28) {
    fVar2 = fVar4 * fVar4 +
            (float)local_58._0_4_ * (float)local_58._0_4_ +
            (float)local_58._4_4_ * (float)local_58._4_4_;
    local_5c = fVar2;
    uStack_24 = in_XMM1_Db;
    fVar3 = inversesqrt<float>(&local_5c);
    local_38 = ZEXT416((uint)args->detm);
    local_48.z = fVar4 * fVar3;
    local_48.y = fVar3 * (float)local_58._4_4_;
    local_48.x = fVar3 * (float)local_58._0_4_;
    (*(this->super_brdf)._vptr_brdf[0xb])(this);
    (*(this->super_brdf)._vptr_brdf[10])(this,&local_68);
    auVar6._0_8_ = local_38._0_8_;
    auVar6._8_4_ = local_38._4_4_;
    auVar6._12_4_ = uStack_24;
    auVar5._8_8_ = auVar6._8_8_;
    auVar5._0_4_ = local_38._0_4_;
    auVar5._4_4_ = local_28 * extraout_XMM0_Da;
    auVar7._4_4_ = extraout_XMM0_Da_00;
    auVar7._0_4_ = fVar2 * fVar2;
    auVar7._8_4_ = 0;
    auVar7._12_4_ = extraout_XMM0_Db;
    auVar7 = divps(auVar5,auVar7);
    fVar1 = (float_t)(-(uint)(0.0 < extraout_XMM0_Da) & (uint)(auVar7._4_4_ * auVar7._0_4_));
  }
  return fVar1;
}

Assistant:

float_t
microfacet::vndf(const vec3 &wm, const vec3 &wi, const args &args) const
{
	vec3 wm_std = args.mtra * wm;
	vec3 wi_std = normalize(args.minv * wi);
	float_t dpd = dot(wm_std, wi_std);

	if (dpd > 0) {
		float_t nrmsqr = dot(wm_std, wm_std);
		float_t nrm = inversesqrt(nrmsqr);
		float_t dwdw = args.detm / sqr(nrmsqr);
		float_t D = ndf_std(wm_std * nrm);
		float_t sigma = sigma_std(wi_std);

		return D > 0 ? dpd * D / sigma * dwdw : 0;
	}

	return 0;
}